

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinFilter
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  HeapEntity *pHVar1;
  HeapEntity *pHVar2;
  anon_union_8_3_4e909c26_for_v aVar3;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  undefined4 uVar4;
  const_reference pvVar5;
  size_type sVar6;
  allocator<char> *__a;
  reference ppHVar7;
  mapped_type *ppHVar8;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  char *in_RSI;
  long in_RDI;
  Value VVar9;
  BindingFrame bindings;
  HeapThunk *thunk;
  HeapArray *arr;
  HeapClosure *func;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000140;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000148;
  string *in_stack_00000150;
  LocationRange *in_stack_00000158;
  Interpreter *in_stack_00000160;
  Frame *f;
  string *in_stack_fffffffffffffe58;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *__n;
  Interpreter *in_stack_fffffffffffffe60;
  value_type pHVar10;
  Interpreter *in_stack_fffffffffffffe68;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  allocator<char> *in_stack_fffffffffffffe90;
  key_type *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 uStack_dc;
  BindingFrame *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff34;
  HeapObject *in_stack_ffffffffffffff38;
  HeapEntity *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  Stack *in_stack_ffffffffffffff50;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined8 local_80;
  allocator<char> local_49;
  string local_48 [32];
  Frame *local_28;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_20;
  char *local_18;
  AST *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = Stack::top((Stack *)0x295f85);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  local_90 = 0x11;
  local_8c = 0x10;
  local_88 = &local_90;
  local_80 = 2;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x296018);
  __l._M_len = (size_type)in_stack_fffffffffffffea0;
  __l._M_array = (iterator)in_stack_fffffffffffffe98;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffe90,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  validateBuiltinArgs(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148,
                      in_stack_00000140);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffffe70);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x29607c);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  pvVar5 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,0);
  pHVar1 = (pvVar5->v).h;
  pvVar5 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,1);
  pHVar2 = (pvVar5->v).h;
  sVar6 = std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                  *)(pHVar1 + 5));
  if (sVar6 != 1) {
    __a = (allocator<char> *)__cxa_allocate_exception(0x38);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff37;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,local_18,__a);
    makeError(in_stack_fffffffffffffe68,(LocationRange *)in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe58);
    __cxa_throw(__a,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  sVar6 = std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                  *)(pHVar2 + 1));
  if (sVar6 == 0) {
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              *)0x29629c);
    VVar9 = makeArray(in_stack_fffffffffffffe60,
                      (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                       *)in_stack_fffffffffffffe58);
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_dc,VVar9.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar9.v;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::~vector(in_stack_fffffffffffffe70);
    local_8 = (AST *)0x0;
  }
  else {
    local_28->kind = FRAME_BUILTIN_FILTER;
    __n = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)0x0;
    pvVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,0);
    uVar4 = *(undefined4 *)&pvVar5->field_0x4;
    aVar3 = pvVar5->v;
    (local_28->val).t = pvVar5->t;
    *(undefined4 *)&(local_28->val).field_0x4 = uVar4;
    (local_28->val).v = aVar3;
    pvVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,1);
    uVar4 = *(undefined4 *)&pvVar5->field_0x4;
    aVar3 = pvVar5->v;
    (local_28->val2).t = pvVar5->t;
    *(undefined4 *)&(local_28->val2).field_0x4 = uVar4;
    (local_28->val2).v = aVar3;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::clear((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)0x296390);
    local_28->elementId = 0;
    ppHVar7 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)(pHVar2 + 1),(ulong)local_28->elementId);
    pHVar10 = *ppHVar7;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)in_stack_fffffffffffffe60,__n);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                  *)(pHVar1 + 5),(size_type)__n);
    ppHVar8 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                            *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *ppHVar8 = pHVar10;
    Stack::newCall(in_stack_ffffffffffffff50,(LocationRange *)in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                   in_stack_ffffffffffffff28);
    local_8 = *(AST **)&pHVar1[6].mark;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x296477);
  }
  return local_8;
}

Assistant:

const AST *builtinFilter(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "filter", args, {Value::FUNCTION, Value::ARRAY});
        auto *func = static_cast<HeapClosure *>(args[0].v.h);
        auto *arr = static_cast<HeapArray *>(args[1].v.h);
        if (func->params.size() != 1) {
            throw makeError(loc, "filter function takes 1 parameter.");
        }
        if (arr->elements.size() == 0) {
            scratch = makeArray({});
        } else {
            f.kind = FRAME_BUILTIN_FILTER;
            f.val = args[0];
            f.val2 = args[1];
            f.thunks.clear();
            f.elementId = 0;

            auto *thunk = arr->elements[f.elementId];
            BindingFrame bindings = func->upValues;
            bindings[func->params[0].id] = thunk;
            stack.newCall(loc, func, func->self, func->offset, bindings);
            return func->body;
        }
        return nullptr;
    }